

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * __thiscall rw::Image::extractMask(Image *this)

{
  uint8 uVar1;
  Image *this_00;
  int local_48;
  int local_44;
  int32 x;
  int32 y;
  uint8 *np;
  uint8 *p;
  uint8 *nline;
  uint8 *line;
  int32 i;
  Image *img;
  Image *this_local;
  
  this_00 = create(this->width,this->height,8);
  allocate(this_00);
  for (line._4_4_ = 0; line._4_4_ < 0x100; line._4_4_ = line._4_4_ + 1) {
    uVar1 = (uint8)line._4_4_;
    this_00->palette[line._4_4_ << 2] = uVar1;
    this_00->palette[line._4_4_ * 4 + 1] = uVar1;
    this_00->palette[line._4_4_ * 4 + 2] = uVar1;
    this_00->palette[line._4_4_ * 4 + 3] = 0xff;
  }
  nline = this->pixels;
  p = this_00->pixels;
  for (local_44 = 0; local_44 < this->height; local_44 = local_44 + 1) {
    np = nline;
    _x = p;
    for (local_48 = 0; local_48 < this->width; local_48 = local_48 + 1) {
      switch(this->depth) {
      case 4:
      case 8:
        *_x = this->palette[(int)((uint)*np * 4 + 3)];
        np = np + 1;
        _x = _x + 1;
        break;
      case 0x10:
        *_x = -((np[1] & 0x80) != 0);
        np = np + 2;
        _x = _x + 1;
        break;
      case 0x18:
        *_x = 0xff;
        np = np + 3;
        _x = _x + 1;
        break;
      case 0x20:
        *_x = np[3];
        np = np + 4;
        _x = _x + 1;
      }
    }
    nline = nline + this->stride;
    p = p + this_00->stride;
  }
  return this_00;
}

Assistant:

Image*
Image::extractMask(void)
{
	Image *img = Image::create(this->width, this->height, 8);
	img->allocate();

	// use an 8bit palette to store all shades of grey
	for(int32 i = 0; i < 256; i++){
		img->palette[i*4+0] = i;
		img->palette[i*4+1] = i;
		img->palette[i*4+2] = i;
		img->palette[i*4+3] = 0xFF;
	}

	// Then use the alpha value as palette index
	uint8 *line = this->pixels;
	uint8 *nline = img->pixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			switch(this->depth){
			case 4:
			case 8:
				*np++ = this->palette[*p*4+3];
				p++;
				break;
			case 16:
				*np++ = 0xFF*!!(p[1]&0x80);
				p += 2;
				break;
			case 24:
				*np++ = 0xFF;
				p += 3;
				break;
			case 32:
				*np++ = p[3];
				p += 4;
				break;
			}
		}
		line += this->stride;
		nline += img->stride;
	}
	return img;
}